

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O2

void __thiscall QFormLayout::insertRow(QFormLayout *this,int row,QWidget *label,QWidget *field)

{
  QFormLayoutPrivate *this_00;
  bool bVar1;
  int row_00;
  
  this_00 = *(QFormLayoutPrivate **)&(this->super_QLayout).field_0x8;
  if ((label != (QWidget *)0x0) &&
     (bVar1 = QLayoutPrivate::checkWidget(&this_00->super_QLayoutPrivate,label), !bVar1)) {
    return;
  }
  if ((field != (QWidget *)0x0) &&
     (bVar1 = QLayoutPrivate::checkWidget(&this_00->super_QLayoutPrivate,field), !bVar1)) {
    return;
  }
  row_00 = QFormLayoutPrivate::insertRow(this_00,row);
  if (label != (QWidget *)0x0) {
    QFormLayoutPrivate::setWidget(this_00,row_00,LabelRole,label);
  }
  if (field != (QWidget *)0x0) {
    QFormLayoutPrivate::setWidget(this_00,row_00,FieldRole,field);
  }
  (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
  return;
}

Assistant:

void QFormLayout::insertRow(int row, QWidget *label, QWidget *field)
{
    Q_D(QFormLayout);
    if ((label && !d->checkWidget(label)) || (field && !d->checkWidget(field)))
        return;

    row = d->insertRow(row);
    if (label)
        d->setWidget(row, LabelRole, label);
    if (field)
        d->setWidget(row, FieldRole, field);
    invalidate();
}